

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::FormatError_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Error *error,
          Type location_type,Color *color,LexerSourceLineFinder *line_finder,
          int source_line_max_length,int indent)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  unsigned_long *puVar5;
  undefined4 in_register_0000000c;
  Color *this_00;
  unsigned_long local_128;
  unsigned_long local_120;
  unsigned_long local_118;
  size_t num_carets;
  size_t num_spaces;
  undefined1 local_100 [8];
  SourceLine source_line;
  string local_b8;
  string local_98;
  Location *local_78;
  Location *loc;
  allocator local_59;
  string local_58 [8];
  string indent_str;
  int source_line_max_length_local;
  LexerSourceLineFinder *line_finder_local;
  Color *color_local;
  Type location_type_local;
  Error *error_local;
  string *result;
  
  indent_str.field_2._12_4_ = SUB84(line_finder,0);
  this_00 = (Color *)CONCAT44(in_register_0000000c,location_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,(long)source_line_max_length,' ',&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  loc._3_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
  pcVar2 = Color::MaybeBoldCode(this_00);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  local_78 = (Location *)(this + 8);
  bVar1 = string_view::empty((string_view *)local_78);
  if (!bVar1) {
    string_view::to_string_abi_cxx11_(&local_98,&local_78->filename);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":");
  }
  if ((int)error == 0) {
    StringPrintf_abi_cxx11_
              (&local_b8,"%d:%d: ",(ulong)(uint)(local_78->field_1).field_0.line,
               (ulong)(uint)(local_78->field_1).field_0.first_column);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else if ((local_78->field_1).field_1.offset != 0xffffffffffffffff) {
    StringPrintf_abi_cxx11_
              ((string *)&source_line.column_offset,"%07zx: ",(local_78->field_1).field_1.offset);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&source_line.column_offset);
    std::__cxx11::string::~string((string *)&source_line.column_offset);
  }
  pcVar2 = Color::MaybeRedCode(this_00);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  pcVar2 = GetErrorLevelName(*(ErrorLevel *)this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
  pcVar2 = Color::MaybeDefaultCode(this_00);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)(this + 0x28));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  LexerSourceLineFinder::SourceLine::SourceLine((SourceLine *)local_100);
  if (color != (Color *)0x0) {
    num_spaces._4_4_ =
         LexerSourceLineFinder::GetSourceLine
                   ((LexerSourceLineFinder *)color,local_78,(long)(int)indent_str.field_2._12_4_,
                    (SourceLine *)local_100);
  }
  uVar3 = std::__cxx11::string::empty((string *)local_100);
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_100);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
    num_carets = (size_t)(~source_line.line.field_2._8_4_ + (local_78->field_1).field_0.first_column
                         );
    local_118 = (unsigned_long)
                ((local_78->field_1).field_0.last_column - (local_78->field_1).field_0.first_column)
    ;
    lVar4 = std::__cxx11::string::size((string *)local_100);
    local_120 = lVar4 - num_carets;
    puVar5 = std::min<unsigned_long>(&local_118,&local_120);
    local_118 = *puVar5;
    local_128 = 1;
    puVar5 = std::max<unsigned_long>(&local_118,&local_128);
    local_118 = *puVar5;
    std::__cxx11::string::append((string *)__return_storage_ptr__,num_carets,' ');
    pcVar2 = Color::MaybeBoldCode(this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    pcVar2 = Color::MaybeGreenCode(this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__,local_118,'^');
    pcVar2 = Color::MaybeDefaultCode(this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  }
  loc._3_1_ = 1;
  LexerSourceLineFinder::SourceLine::~SourceLine((SourceLine *)local_100);
  if ((loc._3_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatError(const Error& error,
                        Location::Type location_type,
                        const Color& color,
                        LexerSourceLineFinder* line_finder,
                        int source_line_max_length,
                        int indent) {
  std::string indent_str(indent, ' ');
  std::string result = indent_str;

  result += color.MaybeBoldCode();

  const Location& loc = error.loc;
  if (!loc.filename.empty()) {
    result += loc.filename.to_string();
    result += ":";
  }

  if (location_type == Location::Type::Text) {
    result += StringPrintf("%d:%d: ", loc.line, loc.first_column);
  } else if (loc.offset != kInvalidOffset) {
    result += StringPrintf("%07" PRIzx ": ", loc.offset);
  }

  result += color.MaybeRedCode();
  result += GetErrorLevelName(error.error_level);
  result += ": ";
  result += color.MaybeDefaultCode();

  result += error.message;
  result += '\n';

  LexerSourceLineFinder::SourceLine source_line;
  if (line_finder) {
    line_finder->GetSourceLine(loc, source_line_max_length, &source_line);
  }

  if (!source_line.line.empty()) {
    result += indent_str;
    result += source_line.line;
    result += '\n';
    result += indent_str;

    size_t num_spaces = (loc.first_column - 1) - source_line.column_offset;
    size_t num_carets = loc.last_column - loc.first_column;
    num_carets = std::min(num_carets, source_line.line.size() - num_spaces);
    num_carets = std::max<size_t>(num_carets, 1);
    result.append(num_spaces, ' ');
    result += color.MaybeBoldCode();
    result += color.MaybeGreenCode();
    result.append(num_carets, '^');
    result += color.MaybeDefaultCode();
    result += '\n';
  }

  return result;
}